

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O3

uint32_t cppnet::FormatLog(char *file,uint32_t line,char *level,char *buf,uint32_t len)

{
  uint uVar1;
  int iVar2;
  uint32_t size;
  uint32_t local_34;
  
  uVar1 = snprintf(buf,(ulong)len,"[%s|",level);
  local_34 = 0x18;
  GetFormatTime(buf + uVar1,&local_34,FTU_MILLISECOND);
  uVar1 = uVar1 + local_34;
  iVar2 = snprintf(buf + uVar1,(ulong)(len - uVar1),"|%s:%d] ",file,line);
  return iVar2 + uVar1;
}

Assistant:

static uint32_t FormatLog(const char* file, uint32_t line, const char* level, char* buf, uint32_t len) {
    // format level
    uint32_t curlen = snprintf(buf, len, "[%s|", level);

    // format time
    uint32_t size = __format_time_buf_size;
    GetFormatTime(buf + curlen, size);
    curlen += size;

    // format other info
    curlen += snprintf(buf + curlen, len - curlen, "|%s:%d] ", file, line);

    return curlen;
}